

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

double __thiscall
amrex::BaseFab<double>::max<(amrex::RunOn)0>(BaseFab<double> *this,Box *subbox,int comp)

{
  int in_EDX;
  long in_RDI;
  anon_class_72_2_94732018 *f;
  double r;
  Array4<const_double> *a;
  undefined1 auStackY_1e8 [64];
  Box *in_stack_fffffffffffffe60;
  Array4<const_double> local_140;
  int local_fc;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  double *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_a8 = *(double **)(in_RDI + 0x10);
  local_b0 = (undefined8 *)(in_RDI + 0x18);
  local_b4 = *(int *)(in_RDI + 0x34);
  local_5c = 0;
  local_88 = *(undefined4 *)local_b0;
  local_6c = 1;
  uStack_84 = *(undefined4 *)(in_RDI + 0x1c);
  local_d0._0_8_ = *local_b0;
  local_7c = 2;
  local_d0.z = *(int *)(in_RDI + 0x20);
  local_8 = (int *)(in_RDI + 0x24);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = in_RDI + 0x24;
  local_1c = 1;
  iStack_34 = *(int *)(in_RDI + 0x28) + 1;
  local_28 = in_RDI + 0x24;
  local_2c = 2;
  local_f0.z = *(int *)(in_RDI + 0x2c) + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_fc = in_EDX;
  local_dc._0_8_ = local_f0._0_8_;
  local_dc.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<const_double>::Array4(&local_140,local_a8,&local_c0,&local_dc,local_b4);
  Array4<const_double>::Array4<const_double,_0>
            ((Array4<const_double> *)&stack0xfffffffffffffe60,&local_140,local_fc);
  f = (anon_class_72_2_94732018 *)std::numeric_limits<double>::lowest();
  memcpy(auStackY_1e8,&stack0xfffffffffffffe60,0x3c);
  LoopOnCpu<amrex::BaseFab<double>::max<(amrex::RunOn)0>(amrex::Box_const&,int)const::_lambda(int,int,int)_1_>
            (in_stack_fffffffffffffe60,f);
  return (double)f;
}

Assistant:

T
BaseFab<T>::max (const Box& subbox, int comp) const noexcept
{
    Array4<T const> const& a = this->const_array(comp);
#ifdef AMREX_USE_GPU
    if (run_on == RunOn::Device && Gpu::inLaunchRegion()) {
        ReduceOps<ReduceOpMax> reduce_op;
        ReduceData<T> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;
        reduce_op.eval(subbox, reduce_data,
        [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            return { a(i,j,k) };
        });
        ReduceTuple hv = reduce_data.value(reduce_op);
        return amrex::get<0>(hv);
    } else
#endif
    {
        T r = std::numeric_limits<T>::lowest();
        amrex::LoopOnCpu(subbox, [=,&r] (int i, int j, int k) noexcept
        {
            r = amrex::max(r, a(i,j,k));
        });
        return r;
    }
}